

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_not_i64_riscv64(TCGContext_conflict11 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg)

{
  TCGv_i64 arg_local;
  TCGv_i64 ret_local;
  TCGContext_conflict11 *tcg_ctx_local;
  
  tcg_gen_op2_i64(tcg_ctx,INDEX_op_not_i64,ret,arg);
  return;
}

Assistant:

void tcg_gen_not_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_not_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg));
        tcg_gen_not_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg));
#elif TCG_TARGET_HAS_not_i64
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_not_i64, ret, arg);
#else
        tcg_gen_xori_i64(tcg_ctx, ret, arg, -1);
#endif
}